

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# button_widgets.cpp
# Opt level: O2

Am_Value_List
list_final_value(Am_Object *inter,Am_Object *new_object,Am_Object *ref_object,
                Am_Value_List *old_value,bool separate_extend)

{
  Am_Value *pAVar1;
  Am_Wrapper *pAVar2;
  Am_List_Item *extraout_RDX;
  int iVar3;
  int iVar4;
  Am_Value_List *this;
  undefined7 in_register_00000081;
  Am_Value_List *this_00;
  char in_R9B;
  bool bVar5;
  Am_Value_List AVar6;
  Am_Object current;
  Am_Value_List all_objects;
  int stopSet;
  int startSet;
  Am_Object widget;
  int stopErase;
  int startErase;
  
  this_00 = (Am_Value_List *)CONCAT71(in_register_00000081,separate_extend);
  Am_Object::Get_Owner(&widget,(Am_Slot_Flags)new_object);
  pAVar1 = Am_Object::Get(&widget,0x82,0);
  Am_Value_List::Am_Value_List(&all_objects,pAVar1);
  Am_Value_List::Am_Value_List((Am_Value_List *)inter);
  current.data = (Am_Object_Data *)0x0;
  calc_ranks(&startSet,&stopSet,&startErase,&stopErase,&Am_No_Object,ref_object,
             (Am_Object *)old_value);
  this = &all_objects;
  Am_Value_List::Start(this);
  if (startSet != -1) {
    iVar4 = startSet;
    if (startSet < 1) {
      iVar4 = 0;
    }
    iVar3 = iVar4;
    while (bVar5 = iVar3 != 0, iVar3 = iVar3 + -1, bVar5) {
      if (in_R9B != '\0') {
        pAVar1 = Am_Value_List::Get(&all_objects);
        Am_Object::operator=(&current,pAVar1);
        Am_Value_List::Start(this_00);
        pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&current);
        bVar5 = Am_Value_List::Member(this_00,pAVar2);
        if (bVar5) {
          pAVar1 = Am_Object::Get(&current,0xcc,0);
          bVar5 = Am_Value::Valid(pAVar1);
          if (bVar5) {
            pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&current);
            Am_Value_List::Add((Am_Value_List *)inter,pAVar2,Am_TAIL,true);
          }
        }
      }
      this = &all_objects;
      Am_Value_List::Next(&all_objects);
    }
    for (; iVar4 <= stopSet; iVar4 = iVar4 + 1) {
      pAVar1 = Am_Value_List::Get(&all_objects);
      Am_Object::operator=(&current,pAVar1);
      pAVar1 = Am_Object::Get(&current,0xcc,0);
      bVar5 = Am_Value::Valid(pAVar1);
      if (bVar5) {
        pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&current);
        Am_Value_List::Add((Am_Value_List *)inter,pAVar2,Am_TAIL,true);
      }
      this = &all_objects;
      Am_Value_List::Next(&all_objects);
    }
  }
  if (in_R9B != '\0') {
    while( true ) {
      this = &all_objects;
      bVar5 = Am_Value_List::Last(&all_objects);
      if (bVar5) break;
      pAVar1 = Am_Value_List::Get(&all_objects);
      Am_Object::operator=(&current,pAVar1);
      Am_Value_List::Start(this_00);
      pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&current);
      bVar5 = Am_Value_List::Member(this_00,pAVar2);
      if (bVar5) {
        pAVar1 = Am_Object::Get(&current,0xcc,0);
        bVar5 = Am_Value::Valid(pAVar1);
        if (bVar5) {
          pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&current);
          Am_Value_List::Add((Am_Value_List *)inter,pAVar2,Am_TAIL,true);
        }
      }
      Am_Value_List::Next(&all_objects);
    }
  }
  set_selected_from_list((Am_Object *)this,&all_objects,(Am_Value_List *)inter);
  Am_Object::~Am_Object(&current);
  Am_Value_List::~Am_Value_List(&all_objects);
  Am_Object::~Am_Object(&widget);
  AVar6.item = extraout_RDX;
  AVar6.data = (Am_Value_List_Data *)inter;
  return AVar6;
}

Assistant:

Am_Value_List
list_final_value(Am_Object &inter, Am_Object &new_object, Am_Object &ref_object,
                 Am_Value_List &old_value, bool separate_extend)
{
  Am_Object widget = inter.Get_Owner();
  Am_Value_List all_objects = widget.Get(Am_GRAPHICAL_PARTS);
  Am_Value_List new_value;
  Am_Object current;

  int startSet, stopSet, startErase, stopErase;
  calc_ranks(startSet, stopSet, startErase, stopErase, Am_No_Object, new_object,
             ref_object);
  all_objects.Start();
  if (startSet != -1) {
    int i;
    for (i = 0; i < startSet; all_objects.Next(), i++) {
      if (separate_extend) { //otherwise, just ignore these
        current = all_objects.Get();
        old_value.Start();
        if (old_value.Member(current)) {
          if (current.Get(Am_ACTIVE).Valid())
            new_value.Add(current);
        }
      }
    }
    for (; i <= stopSet; all_objects.Next(), i++) {
      current = all_objects.Get();
      if (current.Get(Am_ACTIVE).Valid())
        new_value.Add(current);
    }
  }
  if (separate_extend) { //process the rest of the list
    //start from current position in the list
    for (; !all_objects.Last(); all_objects.Next()) {
      current = all_objects.Get();
      old_value.Start();
      if (old_value.Member(current))
        if (current.Get(Am_ACTIVE).Valid())
          new_value.Add(current);
    }
  }
  //now new_value has the final value
  set_selected_from_list(inter, all_objects, new_value);
  return new_value;
}